

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O3

result_type __thiscall
boost::random::
well_engine<unsigned_int,_32UL,_32UL,_0UL,_22UL,_25UL,_26UL,_boost::random::detail::M3<-21>,_boost::random::detail::M3<17>,_boost::random::detail::M4<2346498334U>,_boost::random::detail::M3<15>,_boost::random::detail::M3<-14>,_boost::random::detail::M3<-21>,_boost::random::detail::M1,_boost::random::detail::M0,_boost::random::detail::no_tempering>
::operator()(well_engine<unsigned_int,_32UL,_32UL,_0UL,_22UL,_25UL,_26UL,_boost::random::detail::M3<_21>,_boost::random::detail::M3<17>,_boost::random::detail::M4<2346498334U>,_boost::random::detail::M3<15>,_boost::random::detail::M3<_14>,_boost::random::detail::M3<_21>,_boost::random::detail::M1,_boost::random::detail::M0,_boost::random::detail::no_tempering>
             *this)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar1 = (uint)this->index_;
  uVar3 = (ulong)(uVar1 - 1 & 0x1f);
  uVar2 = this->state_[uVar1 & 0x1f] ^ this->state_[uVar1 + 0x16 & 0x1f] ^
          (this->state_[uVar1 + 0x16 & 0x1f] >> 0x11 | this->state_[uVar1 & 0x1f] << 0x15);
  uVar5 = this->state_[uVar1 + 0x19 & 0x1f] >> 1;
  uVar4 = uVar5 ^ 0x8bdcb91e;
  if ((this->state_[uVar1 + 0x19 & 0x1f] & 1) == 0) {
    uVar4 = uVar5;
  }
  uVar4 = this->state_[uVar1 + 0x1a & 0x1f] >> 0xf ^ this->state_[uVar1 + 0x1a & 0x1f] ^ uVar4;
  uVar5 = uVar2 << 0x15 ^ this->state_[uVar3] << 0xe ^ uVar2 ^ uVar4 ^ this->state_[uVar3];
  this->state_[uVar1 & 0x1f] = uVar4 ^ uVar2;
  this->state_[uVar3] = uVar5;
  this->index_ = uVar3;
  return uVar5;
}

Assistant:

result_type operator()()
    {
        BOOST_CONSTEXPR_OR_CONST UIntType upper_mask = ~0U << p;
        BOOST_CONSTEXPR_OR_CONST UIntType lower_mask = ~upper_mask;

        // v[i,j] = state[(r-i+j) mod r]
        const std::size_t i = mod(index_);

        // Equivalent to r-i but allows to avoid negative values in the
        // following two expressions
        const std::size_t j = i + r;
        const std::size_t k = mod(j - 1); // [i,r-1]
        const std::size_t l = mod(j - 2); // [i,r-2]

        const std::size_t im1 = mod(i + m1);
        const std::size_t im2 = mod(i + m2);
        const std::size_t im3 = mod(i + m3);

        UIntType z0;
        UIntType z1;
        UIntType z2;
        UIntType z3;
        UIntType z4;

        z0 = (state_[k] & upper_mask) | (state_[l] & lower_mask);
        z1 = T0::transform(state_[i]) ^
             T1::transform(state_[im1]);
        z2 = T2::transform(state_[im2]) ^
             T3::transform(state_[im3]);
        z3 = z1 ^ z2;
        z4 = T4::transform(z0) ^ T5::transform(z1) ^
             T6::transform(z2) ^ T7::transform(z3);

        state_[i] = z3; // v[i+1,1]
        state_[k] = z4; // v[i+1,0]

        index_ = k;

        return Tempering::template apply<UIntType, r>(z4, state_, im2);
    }